

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

MapcodeError
decodeExtension(DecodeRec *dec,int dividerx4,int dividery,int lon_offset4,int extremeLat32,
               int maxLon32)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  double x;
  double y;
  int c2;
  int c1;
  int row2;
  int column2;
  int row1;
  int column1;
  int odd;
  int processor;
  int lat32;
  int lon32;
  char *extrapostfix;
  double lon4;
  double lat1;
  int maxLon32_local;
  int extremeLat32_local;
  int lon_offset4_local;
  int dividery_local;
  int dividerx4_local;
  DecodeRec *dec_local;
  
  _lat32 = dec->extension;
  processor = 0;
  odd = 0;
  column1 = 1;
  bVar1 = false;
  sVar5 = strlen(_lat32);
  if (sVar5 < 9) {
    while (extremeLat32_local = dividery, lon_offset4_local = dividerx4, *_lat32 != '\0') {
      pcVar6 = _lat32 + 1;
      cVar2 = decodeChar(*_lat32);
      iVar3 = (int)cVar2;
      if ((iVar3 < 0) || (iVar3 == 0x1e)) {
        return ERR_EXTENSION_INVALID_CHARACTER;
      }
      if (*pcVar6 == '\0') {
        bVar1 = true;
        c2 = 0;
        c1 = 0;
        _lat32 = pcVar6;
      }
      else {
        cVar2 = decodeChar(*pcVar6);
        iVar4 = (int)cVar2;
        if ((iVar4 < 0) || (iVar4 == 0x1e)) {
          return ERR_EXTENSION_INVALID_CHARACTER;
        }
        c2 = iVar4 / 6;
        c1 = iVar4 % 6;
        _lat32 = _lat32 + 2;
      }
      column1 = column1 * 0x1e;
      processor = processor * 0x1e + (iVar3 % 5) * 6 + c1;
      odd = odd * 0x1e + (iVar3 / 5) * 5 + c2;
    }
    for (; column1 < 810000; column1 = column1 * 0x1e) {
      lon_offset4_local = lon_offset4_local * 0x1e;
      extremeLat32_local = extremeLat32_local * 0x1e;
    }
    x = (double)lon_offset4 * 810000.0 +
        (double)((dec->coord32).lonMicroDeg << 2) * 810000.0 +
        (double)processor * (double)lon_offset4_local;
    y = (double)(dec->coord32).latMicroDeg * 810000.0 + (double)odd * (double)extremeLat32_local;
    if (bVar1) {
      setFromFractions(&dec->zone,y,x,(double)(extremeLat32_local * 5),
                       (double)(lon_offset4_local * 6));
    }
    else {
      setFromFractions(&dec->zone,y,x,(double)extremeLat32_local,(double)lon_offset4_local);
    }
    if ((double)maxLon32 * 3240000.0 < (dec->zone).fmaxx) {
      (dec->zone).fmaxx = (double)maxLon32 * 3240000.0;
    }
    if (extremeLat32_local < 0) {
      if ((dec->zone).fminy < (double)extremeLat32 * 810000.0) {
        (dec->zone).fminy = (double)extremeLat32 * 810000.0;
      }
    }
    else if ((double)extremeLat32 * 810000.0 < (dec->zone).fmaxy) {
      (dec->zone).fmaxy = (double)extremeLat32 * 810000.0;
    }
    iVar3 = isEmpty(&dec->zone);
    if (iVar3 == 0) {
      dec_local._4_4_ = ERR_OK;
    }
    else {
      dec_local._4_4_ = ERR_EXTENSION_UNDECODABLE;
    }
  }
  else {
    dec_local._4_4_ = ERR_EXTENSION_INVALID_LENGTH;
  }
  return dec_local._4_4_;
}

Assistant:

static enum MapcodeError decodeExtension(DecodeRec *dec,
                                         int dividerx4, int dividery,
                                         const int lon_offset4,
                                         const int extremeLat32, const int maxLon32) {
    double lat1, lon4;
    const char *extrapostfix = dec->extension;
    int lon32 = 0;
    int lat32 = 0;
    int processor = 1;
    int odd = 0;
    ASSERT(dec);
    if (strlen(extrapostfix) > MAX_PRECISION_DIGITS) {
        return ERR_EXTENSION_INVALID_LENGTH;
    }
    while (*extrapostfix) {
        int column1, row1, column2, row2;
        const int c1 = decodeChar(*extrapostfix++);
        if (c1 < 0 || c1 == 30) {
            return ERR_EXTENSION_INVALID_CHARACTER;
        } // illegal extension character
        row1 = (c1 / 5);
        column1 = (c1 % 5);
        if (*extrapostfix) {
            const int c2 = decodeChar(*extrapostfix++);
            if (c2 < 0 || c2 == 30) {
                return ERR_EXTENSION_INVALID_CHARACTER;
            } // illegal extension character
            row2 = (c2 / 6);
            column2 = (c2 % 6);
        } else {
            odd = 1;
            row2 = 0;
            column2 = 0;
        }

        processor *= 30;
        lon32 = lon32 * 30 + column1 * 6 + column2;
        lat32 = lat32 * 30 + row1 * 5 + row2;
    }

    while (processor < MAX_PRECISION_FACTOR) {
        dividerx4 *= 30;
        dividery *= 30;
        processor *= 30;
    }

    lon4 = (dec->coord32.lonMicroDeg * 4 * (double) MAX_PRECISION_FACTOR) + ((lon32 * (double) dividerx4)) +
           (lon_offset4 * (double) MAX_PRECISION_FACTOR);
    lat1 = (dec->coord32.latMicroDeg * (double) MAX_PRECISION_FACTOR) + ((lat32 * (double) dividery));

    // determine the range of coordinates that are encoded to this mapcode
    if (odd) {
        setFromFractions(&dec->zone, lat1, lon4, 5 * dividery, 6 * dividerx4);
    } else {
        setFromFractions(&dec->zone, lat1, lon4, dividery, dividerx4);
    }

    // restrict the coordinate range to the extremes that were provided
    if (dec->zone.fmaxx > maxLon32 * MICROLON_TO_FRACTIONS_FACTOR) {
        dec->zone.fmaxx = maxLon32 * MICROLON_TO_FRACTIONS_FACTOR;
    }
    if (dividery >= 0) {
        if (dec->zone.fmaxy > extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR) {
            dec->zone.fmaxy = extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR;
        }
    } else {
        if (dec->zone.fminy < extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR) {
            dec->zone.fminy = extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR;
        }
    }
    if (isEmpty(&dec->zone)) {
        return ERR_EXTENSION_UNDECODABLE;
    }
    return ERR_OK;
}